

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_d00101::SHDescriptor::MakeScripts
          (SHDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *param_2,
          Span<const_CScript> scripts,FlatSigningProvider *out)

{
  long lVar1;
  size_type sVar2;
  CScriptID *this_00;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> *ret;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Span<const_CScript> *in_stack_fffffffffffffed8;
  ScriptHash *in_stack_fffffffffffffee0;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *this_01;
  CScript *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  Span<const_CScript>::operator[]
            (in_stack_fffffffffffffed8,CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
            );
  ScriptHash::ScriptHash(in_stack_fffffffffffffee0,(CScript *)in_stack_fffffffffffffed8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffed8,
             (ScriptHash *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  GetScriptForDestination(in_stack_fffffffffffffec8);
  Vector<CScript>(in_stack_ffffffffffffff08);
  CScript::~CScript((CScript *)in_stack_fffffffffffffec8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffffec8);
  sVar2 = std::vector<CScript,_std::allocator<CScript>_>::size
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffec8);
  if (sVar2 != 0) {
    this_00 = (CScriptID *)(in_R9 + 8);
    Span<const_CScript>::operator[]
              (in_stack_fffffffffffffed8,
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    CScriptID::CScriptID(this_00,(CScript *)in_stack_fffffffffffffed8);
    Span<const_CScript>::operator[]
              (in_stack_fffffffffffffed8,
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    std::
    map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>::
    emplace<CScriptID,CScript_const&>(this_01,this_00,(CScript *)in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CScript,_std::allocator<CScript>_> *)in_RDI;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        auto ret = Vector(GetScriptForDestination(ScriptHash(scripts[0])));
        if (ret.size()) out.scripts.emplace(CScriptID(scripts[0]), scripts[0]);
        return ret;
    }